

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_record_field_set_type(coda_type_record_field *field,coda_type *type)

{
  coda_type *type_local;
  coda_type_record_field *field_local;
  
  if (field == (coda_type_record_field *)0x0) {
    coda_set_error(-100,"field argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x430);
    field_local._4_4_ = -1;
  }
  else if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x435);
    field_local._4_4_ = -1;
  }
  else if (field->type == (coda_type *)0x0) {
    field->type = type;
    type->retain_count = type->retain_count + 1;
    field_local._4_4_ = 0;
  }
  else {
    coda_set_error(-400,"field already has a type");
    field_local._4_4_ = -1;
  }
  return field_local._4_4_;
}

Assistant:

int coda_type_record_field_set_type(coda_type_record_field *field, coda_type *type)
{
    if (field == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (field->type != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "field already has a type");
        return -1;
    }
    field->type = type;
    type->retain_count++;
    return 0;
}